

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void emit_sof(j_compress_ptr cinfo,JPEG_MARKER code)

{
  uint uVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  
  emit_byte(cinfo,0xff);
  emit_byte(cinfo,code);
  uVar1 = cinfo->num_components * 3 + 8;
  emit_byte(cinfo,uVar1 >> 8 & 0xff);
  emit_byte(cinfo,uVar1 & 0xff);
  if ((0xffff < cinfo->image_height) || (0xffff < cinfo->image_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffff00000029;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  emit_byte(cinfo,cinfo->data_precision);
  uVar1 = cinfo->image_height;
  emit_byte(cinfo,uVar1 >> 8 & 0xff);
  emit_byte(cinfo,uVar1 & 0xff);
  uVar1 = cinfo->image_width;
  emit_byte(cinfo,uVar1 >> 8 & 0xff);
  emit_byte(cinfo,uVar1 & 0xff);
  emit_byte(cinfo,cinfo->num_components);
  if (0 < cinfo->num_components) {
    pjVar3 = cinfo->comp_info;
    iVar2 = 0;
    do {
      emit_byte(cinfo,pjVar3->component_id);
      emit_byte(cinfo,pjVar3->h_samp_factor * 0x10 + pjVar3->v_samp_factor);
      emit_byte(cinfo,pjVar3->quant_tbl_no);
      iVar2 = iVar2 + 1;
      pjVar3 = pjVar3 + 1;
    } while (iVar2 < cinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
emit_sof(j_compress_ptr cinfo, JPEG_MARKER code)
/* Emit a SOF marker */
{
  int ci;
  jpeg_component_info *compptr;

  emit_marker(cinfo, code);

  emit_2bytes(cinfo, 3 * cinfo->num_components + 2 + 5 + 1); /* length */

  /* Make sure image isn't bigger than SOF field can handle */
  if ((long)cinfo->_jpeg_height > 65535L || (long)cinfo->_jpeg_width > 65535L)
    ERREXIT1(cinfo, JERR_IMAGE_TOO_BIG, (unsigned int)65535);

  emit_byte(cinfo, cinfo->data_precision);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_height);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_width);

  emit_byte(cinfo, cinfo->num_components);

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    emit_byte(cinfo, compptr->component_id);
    emit_byte(cinfo, (compptr->h_samp_factor << 4) + compptr->v_samp_factor);
    emit_byte(cinfo, compptr->quant_tbl_no);
  }
}